

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_sbit_decoder_load_compound
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  FT_Byte *pFVar1;
  FT_Short FVar2;
  FT_Short FVar3;
  FT_Short FVar4;
  FT_Short FVar5;
  TT_SBit_Metrics pTVar6;
  FT_Bitmap *pFVar7;
  FT_UShort FVar8;
  FT_UShort FVar9;
  FT_Error FVar10;
  ushort uVar11;
  long lVar12;
  char local_44;
  char local_42;
  char local_40;
  char local_3e;
  
  pFVar1 = p + 2;
  FVar10 = 3;
  if ((pFVar1 <= limit) &&
     (uVar11 = *(ushort *)p << 8 | *(ushort *)p >> 8, pFVar1 + (ulong)uVar11 * 4 <= limit)) {
    pTVar6 = decoder->metrics;
    FVar2 = pTVar6->horiBearingX;
    FVar3 = pTVar6->horiBearingY;
    FVar8 = pTVar6->horiAdvance;
    FVar4 = pTVar6->vertBearingX;
    FVar5 = pTVar6->vertBearingY;
    FVar9 = pTVar6->vertAdvance;
    if (uVar11 == 0) {
      FVar10 = 0;
    }
    else {
      lVar12 = 0;
      do {
        FVar10 = tt_sbit_decoder_load_image
                           (decoder,(uint)(ushort)(*(ushort *)(pFVar1 + lVar12 * 4) << 8 |
                                                  *(ushort *)(pFVar1 + lVar12 * 4) >> 8),
                            (char)p[lVar12 * 4 + 4] + x_pos,(char)p[lVar12 * 4 + 5] + y_pos,
                            recurse_count + 1,'\0');
        if (FVar10 != 0) break;
        lVar12 = lVar12 + 1;
      } while ((uint)lVar12 < (uint)uVar11);
    }
    local_44 = (char)FVar2;
    pTVar6 = decoder->metrics;
    pTVar6->horiBearingX = (short)local_44;
    local_42 = (char)FVar3;
    pTVar6->horiBearingY = (short)local_42;
    pTVar6->horiAdvance = (ushort)(byte)FVar8;
    local_40 = (char)FVar4;
    pTVar6->vertBearingX = (short)local_40;
    local_3e = (char)FVar5;
    pTVar6->vertBearingY = (short)local_3e;
    pTVar6->vertAdvance = (ushort)(byte)FVar9;
    pFVar7 = decoder->bitmap;
    pTVar6->width = (ushort)(byte)pFVar7->width;
    pTVar6->height = (ushort)(byte)pFVar7->rows;
  }
  return FVar10;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_compound( TT_SBitDecoder  decoder,
                                 FT_Byte*        p,
                                 FT_Byte*        limit,
                                 FT_Int          x_pos,
                                 FT_Int          y_pos,
                                 FT_UInt         recurse_count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   num_components, nn;

    FT_Char  horiBearingX = (FT_Char)decoder->metrics->horiBearingX;
    FT_Char  horiBearingY = (FT_Char)decoder->metrics->horiBearingY;
    FT_Byte  horiAdvance  = (FT_Byte)decoder->metrics->horiAdvance;
    FT_Char  vertBearingX = (FT_Char)decoder->metrics->vertBearingX;
    FT_Char  vertBearingY = (FT_Char)decoder->metrics->vertBearingY;
    FT_Byte  vertAdvance  = (FT_Byte)decoder->metrics->vertAdvance;


    if ( p + 2 > limit )
      goto Fail;

    num_components = FT_NEXT_USHORT( p );
    if ( p + 4 * num_components > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_compound: broken table\n" ));
      goto Fail;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: loading %d component%s\n",
                num_components,
                num_components == 1 ? "" : "s" ));

    for ( nn = 0; nn < num_components; nn++ )
    {
      FT_UInt  gindex = FT_NEXT_USHORT( p );
      FT_Char  dx     = FT_NEXT_CHAR( p );
      FT_Char  dy     = FT_NEXT_CHAR( p );


      /* NB: a recursive call */
      error = tt_sbit_decoder_load_image( decoder,
                                          gindex,
                                          x_pos + dx,
                                          y_pos + dy,
                                          recurse_count + 1,
                                          /* request full bitmap image */
                                          FALSE );
      if ( error )
        break;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: done\n" ));

    decoder->metrics->horiBearingX = horiBearingX;
    decoder->metrics->horiBearingY = horiBearingY;
    decoder->metrics->horiAdvance  = horiAdvance;
    decoder->metrics->vertBearingX = vertBearingX;
    decoder->metrics->vertBearingY = vertBearingY;
    decoder->metrics->vertAdvance  = vertAdvance;
    decoder->metrics->width        = (FT_Byte)decoder->bitmap->width;
    decoder->metrics->height       = (FT_Byte)decoder->bitmap->rows;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }